

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O3

void __thiscall wasm::MergeBlocks::visitExpression(MergeBlocks *this,Expression *curr)

{
  Expression *pEVar1;
  Expression *pEVar2;
  uintptr_t uVar3;
  bool bVar4;
  undefined7 extraout_var;
  Expression ***pppEVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ChildIterator *pCVar12;
  uint uVar13;
  size_type __n;
  EffectAnalyzer *effects;
  EffectAnalyzer *other;
  undefined1 local_250 [8];
  EffectAnalyzer blockChildEffects;
  undefined1 local_b8 [8];
  ChildIterator iterator;
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> childEffects;
  Expression *local_50;
  Expression *child;
  Expression *back;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_38;
  
  if ((0x31 < (ulong)curr->_id) || ((0x200000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)) {
    iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_b8,curr);
    uVar8 = ((ulong)((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                           flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_start -
                    (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3]) >> 3) + (long)local_b8;
    iVar6 = (int)uVar8;
    if (iVar6 != 0) {
      lVar10 = (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_start -
               (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                     _M_elems[3] >> 3;
      if ((ulong)(lVar10 + (long)local_b8) <= (ulong)(iVar6 - 1)) {
LAB_007aeed6:
        __assert_fail("index < children.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/iteration.h"
                      ,0x4a,
                      "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                     );
      }
      uVar9 = (long)local_b8 + lVar10;
      uVar13 = 0xffffffff;
      uVar11 = 0;
      do {
        uVar9 = uVar9 - 1;
        pCVar12 = (ChildIterator *)
                  (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   [3] + -4);
        if ((uVar9 & 0xfffffffc) == 0) {
          pCVar12 = &iterator;
        }
        __n = uVar11 & 0xffffffff;
        if ((*(pCVar12->super_AbstractChildIterator<wasm::ChildIterator>).children.fixed._M_elems
              [(uVar9 & 0xffffffff) - 1])->_id != BlockId) {
          __n = (size_type)uVar13;
        }
        uVar11 = uVar11 + 1;
        uVar13 = (uint)__n;
      } while ((uVar8 & 0xffffffff) != uVar11);
      if (uVar13 != 0xffffffff) {
        if (uVar13 != 0) {
          std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::reserve
                    ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
                     ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                             flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data + 0x10),__n);
        }
        uVar8 = 0;
        back = (Expression *)0x0;
        do {
          uVar9 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible
                         .
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                   (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                         _M_elems[3] >> 3) + (long)local_b8;
          if (uVar9 <= uVar8) goto LAB_007aeed6;
          blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               ~uVar8;
          uVar7 = (int)uVar9 +
                  (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
          pppEVar5 = (Expression ***)
                     (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                      _M_elems[3] + ((ulong)uVar7 - 4));
          if ((uVar7 & 0xfffffffc) == 0) {
            pppEVar5 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                       _M_elems + ((ulong)uVar7 - 1);
          }
          pEVar1 = **pppEVar5;
          local_50 = pEVar1;
          if (((pEVar1->_id == BlockId) && (pEVar1[1].type.id == 0)) &&
             (uVar9 = pEVar1[2].type.id, 1 < uVar9)) {
            uVar11 = 0;
            do {
              if (*(long *)(*(long *)(*(long *)(pEVar1 + 2) + uVar11 * 8) + 8) == 1)
              goto LAB_007aebf6;
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
            child = *(Expression **)(*(long *)(pEVar1 + 2) + -8 + uVar9 * 8);
            if ((pEVar1->type).id == (child->type).id) {
              local_38 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)0x0
              ;
              uVar11 = 0;
              while( true ) {
                if (pEVar1[2].type.id <= uVar11) goto LAB_007aeef5;
                pEVar2 = *(Expression **)(*(long *)(pEVar1 + 2) + uVar11 * 8);
                if (pEVar2 == child) break;
                EffectAnalyzer::EffectAnalyzer
                          ((EffectAnalyzer *)local_250,
                           &((this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).super_Pass.runner)->options,
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).
                           super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .
                           super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .currModule,pEVar2);
                for (other = (EffectAnalyzer *)
                             iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                             flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    other != (EffectAnalyzer *)0x0; other = other + 1) {
                  bVar4 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_250,other);
                  if (bVar4) {
                    local_38 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)CONCAT71(extraout_var,1);
                    break;
                  }
                }
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.danglingPop);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.mutableGlobalsRead._M_t._M_impl.
                                super__Rb_tree_header._M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.features);
                if (blockChildEffects.funcEffectsMap.
                    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             blockChildEffects.funcEffectsMap.
                             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                }
                uVar11 = uVar11 + 1;
                if ((uVar11 == uVar9) || (((ulong)local_38 & 1) != 0)) break;
              }
              if (((ulong)local_38 & 1) == 0) {
                uVar3 = pEVar1[2].type.id;
                if (back == (Expression *)0x0) {
                  if (uVar3 == 0) {
                    __assert_fail("usedElements > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                                  ,0xd5,
                                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::pop_back() [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                 );
                  }
                  pEVar1[2].type.id = uVar3 - 1;
                  back = pEVar1;
                }
                else if (uVar3 != 0) {
                  local_38 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )(back + 2);
                  uVar9 = 0;
                  do {
                    if (pEVar1[2].type.id <= uVar9) {
LAB_007aeef5:
                      __assert_fail("index < usedElements",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                                    ,0xbc,
                                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                   );
                    }
                    pEVar2 = *(Expression **)(*(long *)(pEVar1 + 2) + uVar9 * 8);
                    if (pEVar2 == child) break;
                    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                              (local_38,pEVar2);
                    uVar9 = uVar9 + 1;
                  } while (uVar3 != uVar9);
                }
                uVar9 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               fixed._M_elems[3] >> 3) + (long)local_b8;
                if (uVar9 <= uVar8) goto LAB_007aeed6;
                uVar7 = (int)uVar9 +
                        (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count;
                pppEVar5 = (Expression ***)
                           (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                            ._M_elems[3] + ((ulong)uVar7 - 4));
                if ((uVar7 & 0xfffffffc) == 0) {
                  pppEVar5 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                             fixed._M_elems + ((ulong)uVar7 - 1);
                }
                **pppEVar5 = child;
                if (uVar8 < __n) {
                  std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                  emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                            ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                             ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                     children.flexible.
                                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                     ._M_impl.super__Vector_impl_data + 0x10),
                             &((this->
                               super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                               ).super_Pass.runner)->options,
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).
                             super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                             .
                             super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                             .currModule,&child);
                }
              }
              else {
                std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                          ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                           ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                   children.flexible.
                                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                   ._M_impl.super__Vector_impl_data + 0x10),
                           &((this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).super_Pass.runner)->options,
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).
                           super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .
                           super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .currModule,&local_50);
              }
            }
            else {
              std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
              emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                        ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                         ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                 flexible.
                                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                 ._M_impl.super__Vector_impl_data + 0x10),
                         &((this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).super_Pass.runner)->options,
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                         ).
                         super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         .
                         super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         .currModule,&local_50);
            }
          }
          else {
LAB_007aebf6:
            std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
            emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                      ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                       ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data + 0x10),
                       &((this->
                         super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                         ).super_Pass.runner)->options,
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                       ).
                       super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .
                       super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .currModule,&local_50);
          }
          pEVar1 = back;
          uVar8 = uVar8 + 1;
        } while (uVar13 + 1 != (int)uVar8);
        if (back != (Expression *)0x0) {
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (back + 2),curr);
          Block::finalize((Block *)pEVar1,(Type)(curr->type).id);
          Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                          ).
                          super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                          .
                          super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         ,pEVar1);
        }
      }
    }
    if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3] !=
        (Expression **)0x0) {
      operator_delete(iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                      _M_elems[3],
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                            ._M_elems[3]);
    }
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
               ((long)&iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data + 0x10));
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Control flow need special handling. Those we can optimize are handled
    // below.
    if (Properties::isControlFlowStructure(curr)) {
      return;
    }

    // As we go through the children, to move things to the outside means
    // moving them past the children before them:
    //
    //  (parent
    //   (child1
    //    (A)
    //    (B)
    //   )
    //   (child2
    //
    // If we move (A) out of parent, then that is fine (further things moved
    // out would appear after it). But if we leave (B) in its current position
    // then if we try to move anything from child2 out of parent then we must
    // move those things past (B). We use a vector to track the effects of the
    // children, where it contains the effects of what was left in the child
    // after optimization.
    std::vector<EffectAnalyzer> childEffects;

    ChildIterator iterator(curr);
    auto numChildren = iterator.getNumChildren();

    // Find the last block among the children, as all we are trying to do here
    // is move the contents of blocks outwards.
    Index lastBlock = -1;
    for (Index i = 0; i < numChildren; i++) {
      if (iterator.getChild(i)->is<Block>()) {
        lastBlock = i;
      }
    }
    if (lastBlock == Index(-1)) {
      // There are no blocks at all, so there is nothing to optimize.
      return;
    }

    // We'll only compute effects up to the child before the last block, since
    // we have nothing to optimize afterwards, which sets a maximum size on the
    // vector.
    if (lastBlock > 0) {
      childEffects.reserve(lastBlock);
    }

    // The outer block that will replace us, containing the contents moved out
    // and then ourselves, assuming we manage to optimize.
    Block* outerBlock = nullptr;

    for (Index i = 0; i <= lastBlock; i++) {
      auto* child = iterator.getChild(i);
      auto* block = child->dynCast<Block>();

      auto continueEarly = [&]() {
        // When we continue early, after failing to find anything to optimize,
        // the effects we need to note for the child are simply those of the
        // child in its original form.
        childEffects.emplace_back(getPassOptions(), *getModule(), child);
      };

      // If there is no block, or it is one that might have branches, or it is
      // too small for us to remove anything from (we cannot remove the last
      // element), or if it has unreachable code (leave that for dce), then give
      // up.
      if (!block || block->name.is() || block->list.size() <= 1 ||
          hasUnreachableChild(block)) {
        continueEarly();
        continue;
      }

      // Also give up if the block's last element has a different type than the
      // block, as that would mean we would change the type received by the
      // parent (which might cause its type to need to be updated, for example).
      // Leave this alone, as other passes will simplify this anyhow (using
      // refinalize).
      auto* back = block->list.back();
      if (block->type != back->type) {
        continueEarly();
        continue;
      }

      // The block seems to have the shape we want. Check for effects: we want
      // to move all the items out but the last one, so they must all cross over
      // anything we need to move past.
      //
      // In principle we could also handle the case where we can move out only
      // some of the block items. However, that would be more complex (we'd need
      // to allocate a new block sometimes), it is rare, and it may not always
      // be helpful (we wouldn't actually be getting rid of the child block -
      // although, in the binary format such blocks tend to vanish anyhow).
      bool fail = false;
      for (auto* blockChild : block->list) {
        if (blockChild == back) {
          break;
        }
        EffectAnalyzer blockChildEffects(
          getPassOptions(), *getModule(), blockChild);
        for (auto& effects : childEffects) {
          if (blockChildEffects.invalidates(effects)) {
            fail = true;
            break;
          }
        }
        if (fail) {
          break;
        }
      }
      if (fail) {
        continueEarly();
        continue;
      }

      // Wonderful, we can do this! Move our items to an outer block, reusing
      // this one if there isn't one already.
      if (!outerBlock) {
        // Leave all the items there, just remove the last one which will remain
        // where it was.
        block->list.pop_back();
        outerBlock = block;
      } else {
        // Move the items to the existing outer block.
        for (auto* blockChild : block->list) {
          if (blockChild == back) {
            break;
          }
          outerBlock->list.push_back(blockChild);
        }
      }

      // Set the back element as the new child, replacing the block that was
      // there.
      iterator.getChild(i) = back;

      // If there are further elements, we need to know what effects the
      // remaining code has, as if they move they'll move past it.
      if (i < lastBlock) {
        childEffects.emplace_back(getPassOptions(), *getModule(), back);
      }
    }

    if (outerBlock) {
      // We moved items outside, which means we must replace ourselves with the
      // block.
      outerBlock->list.push_back(curr);
      outerBlock->finalize(curr->type);
      replaceCurrent(outerBlock);
    }
  }